

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  pointer pbVar2;
  pointer pIVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  OptionAdder *pOVar8;
  ostream *poVar9;
  OptionDetails *pOVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  ulong __n;
  reference pvVar13;
  int *piVar14;
  Input *input;
  long lVar15;
  pointer pIVar16;
  uint uVar17;
  pointer pbVar18;
  char *pcVar19;
  string *path;
  value_type vVar20;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  uint role;
  allocator local_cbf;
  allocator local_cbe;
  allocator local_cbd;
  allocator local_cbc;
  allocator local_cbb;
  allocator local_cba;
  allocator local_cb9;
  allocator local_cb8;
  allocator local_cb7;
  allocator local_cb6;
  allocator local_cb5;
  allocator local_cb4;
  allocator local_cb3;
  allocator local_cb2;
  allocator local_cb1;
  allocator local_cb0;
  allocator local_caf;
  allocator local_cae;
  allocator local_cad;
  allocator local_cac;
  allocator local_cab;
  allocator local_caa;
  allocator local_ca9;
  allocator local_ca8;
  allocator local_ca7;
  allocator local_ca6;
  allocator local_ca5;
  allocator local_ca4;
  allocator local_ca3;
  allocator local_ca2;
  allocator local_ca1;
  FunKeyMonkeyModule module;
  value_type local_c70;
  int argc_local;
  vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_> inputs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> deviceRoles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  moduleArgs;
  ulong local_c08;
  shared_ptr<const_cxxopts::Value> local_bf8;
  element_type *local_be8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_be0;
  shared_ptr<const_cxxopts::Value> local_bd8;
  element_type *local_bc8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_bc0;
  shared_ptr<const_cxxopts::Value> local_bb8;
  element_type *local_ba8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_ba0;
  shared_ptr<const_cxxopts::Value> local_b98;
  element_type *local_b88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_b80;
  shared_ptr<const_cxxopts::Value> local_b78;
  element_type *local_b68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_b60;
  shared_ptr<const_cxxopts::Value> local_b58;
  element_type *local_b48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_b40;
  shared_ptr<const_cxxopts::Value> local_b38;
  element_type *local_b28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_b20;
  shared_ptr<const_cxxopts::Value> local_b18;
  pointer local_b08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b00;
  pointer local_af8;
  char **argv_local;
  string local_ae8;
  element_type *local_ac8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_ac0;
  shared_ptr<const_cxxopts::Value> local_ab8;
  element_type *local_aa8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_aa0;
  shared_ptr<const_cxxopts::Value> local_a98;
  element_type *local_a88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a80;
  string local_a78;
  string local_a58;
  string local_a38;
  string local_a18;
  string local_9f8;
  string local_9d8;
  string local_9b8;
  string local_998;
  string local_978;
  string local_958;
  string local_938;
  string local_918;
  string local_8f8;
  string local_8d8;
  string local_8b8;
  string local_898;
  string local_878;
  string local_858;
  string local_838;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  Options options;
  OptionException e;
  
  argc_local = argc;
  argv_local = argv;
  std::__cxx11::string::string((string *)&local_738,*argv,(allocator *)&e);
  std::__cxx11::string::string
            ((string *)&local_758," - A evdev/uinput wrangler",(allocator *)&module);
  cxxopts::Options::Options(&options,&local_738,&local_758);
  std::__cxx11::string::~string((string *)&local_758);
  std::__cxx11::string::~string((string *)&local_738);
  std::__cxx11::string::string((string *)&local_778,"",&local_ca1);
  cxxopts::Options::add_options((OptionAdder *)&e,&options,&local_778);
  std::__cxx11::string::string((string *)&module,"i,device",&local_ca2);
  std::__cxx11::string::string
            ((string *)&role,
             "Input device to read from, eg. /dev/input/event0, multiple can be provided",&local_ca3
            );
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  local_b18.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_b28;
  local_b18.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_b20._M_pi;
  local_b28 = (element_type *)0x0;
  _Stack_b20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_798,"PATH",&local_ca4);
  pOVar8 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)&e,(string *)&module,(string *)&role,&local_b18,&local_798);
  std::__cxx11::string::string((string *)&deviceRoles,"m,match-devices",&local_ca5);
  std::__cxx11::string::string
            ((string *)&inputs,
             "Regular expression to match device strings (format: \'<vendor>,<product>,<version>,<name>\') with, matching will be read, multiple can be provided"
             ,&local_ca6);
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  local_b38.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_b48;
  local_b38.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_b40._M_pi;
  local_b48 = (element_type *)0x0;
  _Stack_b40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_7b8,"PATTERN",&local_ca7);
  pOVar8 = cxxopts::OptionAdder::operator()
                     (pOVar8,(string *)&deviceRoles,(string *)&inputs,&local_b38,&local_7b8);
  std::__cxx11::string::string((string *)&moduleArgs,"r,roles",&local_ca8);
  std::__cxx11::string::string
            ((string *)&local_ae8,
             "A comma-separated list of role numbers. Roles will be assigned to devices in order of definition, path-based first. Devices matching a match-devices get one role."
             ,&local_ca9);
  cxxopts::value<std::__cxx11::string>();
  local_b58.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_b68;
  local_b58.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_b60._M_pi;
  local_b68 = (element_type *)0x0;
  _Stack_b60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_7d8,"ROLES",&local_caa);
  pOVar8 = cxxopts::OptionAdder::operator()
                     (pOVar8,(string *)&moduleArgs,&local_ae8,&local_b58,&local_7d8);
  std::__cxx11::string::string((string *)&local_7f8,"p,plugin",&local_cab);
  std::__cxx11::string::string((string *)&local_818,"Path to plugin",&local_cac);
  cxxopts::value<std::__cxx11::string>();
  local_b78.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_b88;
  local_b78.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_b80._M_pi;
  local_b88 = (element_type *)0x0;
  _Stack_b80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_838,"PATH",&local_cad);
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_7f8,&local_818,&local_b78,&local_838);
  std::__cxx11::string::string((string *)&local_858,"g,grab",&local_cae);
  std::__cxx11::string::string
            ((string *)&local_878,"Grab the input device, preventing others from accessing it",
             &local_caf);
  cxxopts::value<bool>();
  local_b98.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_ba8;
  local_b98.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_ba0._M_pi;
  local_ba8 = (element_type *)0x0;
  _Stack_ba0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_898,"",&local_cb0);
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_858,&local_878,&local_b98,&local_898);
  std::__cxx11::string::string((string *)&local_8b8,"v,verbose",&local_cb1);
  std::__cxx11::string::string((string *)&local_8d8,"Print extra runtime information",&local_cb2);
  cxxopts::value<bool>();
  local_bb8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_bc8;
  local_bb8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_bc0._M_pi;
  local_bc8 = (element_type *)0x0;
  _Stack_bc0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_8f8,"",&local_cb3);
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_8b8,&local_8d8,&local_bb8,&local_8f8);
  std::__cxx11::string::string((string *)&local_918,"d,daemonize",&local_cb4);
  std::__cxx11::string::string((string *)&local_938,"Daemonize process",&local_cb5);
  cxxopts::value<bool>();
  local_bd8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_a88;
  local_bd8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_a80._M_pi;
  local_a88 = (element_type *)0x0;
  _Stack_a80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_958,"",&local_cb6);
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_918,&local_938,&local_bd8,&local_958);
  std::__cxx11::string::string((string *)&local_978,"l,list-devices",&local_cb7);
  std::__cxx11::string::string((string *)&local_998,"List available devices",&local_cb8);
  cxxopts::value<bool>();
  local_a98.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_be8;
  local_a98.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_be0._M_pi;
  local_be8 = (element_type *)0x0;
  _Stack_be0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_9b8,"",&local_cb9);
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_978,&local_998,&local_a98,&local_9b8);
  std::__cxx11::string::string((string *)&local_9d8,"X,plugin-parameter",&local_cba);
  std::__cxx11::string::string((string *)&local_9f8,"Plugin parameter",&local_cbb);
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  local_bf8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_aa8;
  local_bf8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_aa0._M_pi;
  local_aa8 = (element_type *)0x0;
  _Stack_aa0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_a18,"ARG",&local_cbc);
  pOVar8 = cxxopts::OptionAdder::operator()(pOVar8,&local_9d8,&local_9f8,&local_bf8,&local_a18);
  std::__cxx11::string::string((string *)&local_a38,"h,help",&local_cbd);
  std::__cxx11::string::string((string *)&local_a58,"Print help",&local_cbe);
  cxxopts::value<bool>();
  local_ab8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_ac8;
  local_ab8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_ac0._M_pi;
  local_ac8 = (element_type *)0x0;
  _Stack_ac0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_a78,"",&local_cbf);
  cxxopts::OptionAdder::operator()(pOVar8,&local_a38,&local_a58,&local_ab8,&local_a78);
  std::__cxx11::string::~string((string *)&local_a78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_ab8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_ac0);
  std::__cxx11::string::~string((string *)&local_a58);
  std::__cxx11::string::~string((string *)&local_a38);
  std::__cxx11::string::~string((string *)&local_a18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_bf8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_aa0);
  std::__cxx11::string::~string((string *)&local_9f8);
  std::__cxx11::string::~string((string *)&local_9d8);
  std::__cxx11::string::~string((string *)&local_9b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a98.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_be0);
  std::__cxx11::string::~string((string *)&local_998);
  std::__cxx11::string::~string((string *)&local_978);
  std::__cxx11::string::~string((string *)&local_958);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_bd8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_a80);
  std::__cxx11::string::~string((string *)&local_938);
  std::__cxx11::string::~string((string *)&local_918);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_bb8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_bc0);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::__cxx11::string::~string((string *)&local_8b8);
  std::__cxx11::string::~string((string *)&local_898);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b98.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_ba0);
  std::__cxx11::string::~string((string *)&local_878);
  std::__cxx11::string::~string((string *)&local_858);
  std::__cxx11::string::~string((string *)&local_838);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b78.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_b80);
  std::__cxx11::string::~string((string *)&local_818);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::__cxx11::string::~string((string *)&local_7d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b58.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_b60);
  std::__cxx11::string::~string((string *)&local_ae8);
  std::__cxx11::string::~string((string *)&moduleArgs);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b38.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_b40);
  std::__cxx11::string::~string((string *)&inputs);
  std::__cxx11::string::~string((string *)&deviceRoles);
  std::__cxx11::string::~string((string *)&local_798);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b18.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_b20);
  std::__cxx11::string::~string((string *)&role);
  std::__cxx11::string::~string((string *)&module);
  std::__cxx11::string::~string((string *)&e.m_message);
  std::__cxx11::string::~string((string *)&local_778);
  if (argc_local == 1) {
    std::__cxx11::string::string((string *)&e,"",(allocator *)&deviceRoles);
    std::__cxx11::string::string
              ((string *)(e.m_message.field_2._M_local_buf + 8),"Group",(allocator *)&inputs);
    __l._M_len = 2;
    __l._M_array = (iterator)&e;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&role,__l,(allocator_type *)&moduleArgs);
    cxxopts::Options::help
              ((string *)&module,&options,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&role);
    poVar9 = std::operator<<((ostream *)&std::cout,(string *)&module);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::__cxx11::string::~string((string *)&module);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&role);
    lVar15 = 0x20;
    do {
      std::__cxx11::string::~string((string *)(&e.super_exception + lVar15));
      lVar15 = lVar15 + -0x20;
    } while (lVar15 != -0x20);
  }
  else {
    cxxopts::Options::parse(&options,&argc_local,&argv_local);
    std::__cxx11::string::string((string *)&e,"v",(allocator *)&module);
    iVar6 = cxxopts::Options::count(&options,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::string((string *)&e,"h",(allocator *)&module);
    iVar7 = cxxopts::Options::count(&options,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    if (iVar7 == 0) {
      std::__cxx11::string::string((string *)&e,"l",(allocator *)&module);
      iVar7 = cxxopts::Options::count(&options,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      if (iVar7 == 0) {
        std::__cxx11::string::string((string *)&e,"i",(allocator *)&role);
        iVar7 = cxxopts::Options::count(&options,(string *)&e);
        if (iVar7 < 1) {
          std::__cxx11::string::string((string *)&module,"m",(allocator *)&deviceRoles);
          iVar7 = cxxopts::Options::count(&options,(string *)&module);
          std::__cxx11::string::~string((string *)&module);
          std::__cxx11::string::~string((string *)&e);
          if (0 < iVar7) goto LAB_0012e522;
          pcVar19 = "ERROR: at least one input device path or match pattern is required";
        }
        else {
          std::__cxx11::string::~string((string *)&e);
LAB_0012e522:
          std::__cxx11::string::string((string *)&e,"p",(allocator *)&module);
          iVar7 = cxxopts::Options::count(&options,(string *)&e);
          std::__cxx11::string::~string((string *)&e);
          if (iVar7 == 1) {
            deviceRoles.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            deviceRoles.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            deviceRoles.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::__cxx11::string::string((string *)&e,"r",(allocator *)&module);
            iVar7 = cxxopts::Options::count(&options,(string *)&e);
            std::__cxx11::string::~string((string *)&e);
            if (iVar7 == 0) {
LAB_0012e754:
              inputs.super__Vector_base<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              inputs.super__Vector_base<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              inputs.super__Vector_base<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::__cxx11::string::string((string *)&e,"i",(allocator *)&module);
              pOVar10 = cxxopts::Options::operator[](&options,(string *)&e);
              pvVar12 = cxxopts::OptionDetails::
                        as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                  (pOVar10);
              std::__cxx11::string::~string((string *)&e);
              pbVar2 = (pvVar12->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              for (pbVar18 = (pvVar12->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start; pbVar18 != pbVar2;
                  pbVar18 = pbVar18 + 1) {
                __n = ((long)inputs.
                             super__Vector_base<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)inputs.
                            super__Vector_base<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x28;
                vVar20 = 0;
                if (__n < (ulong)((long)deviceRoles.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)deviceRoles.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 2)) {
                  pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                      (&deviceRoles,__n);
                  vVar20 = *pvVar13;
                }
                std::__cxx11::string::string((string *)&e,(string *)pbVar18);
                e.m_message.field_2._8_4_ = vVar20;
                std::vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>::
                emplace_back<EvdevDevice::Input>(&inputs,(Input *)&e);
                std::__cxx11::string::~string((string *)&e);
              }
              std::__cxx11::string::string((string *)&e,"m",(allocator *)&module);
              iVar7 = cxxopts::Options::count(&options,(string *)&e);
              std::__cxx11::string::~string((string *)&e);
              if (0 < iVar7) {
                local_c08 = ((long)inputs.
                                   super__Vector_base<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)inputs.
                                  super__Vector_base<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x28;
                EvdevDevice::availableDevices();
                std::__cxx11::string::string((string *)&e,"m",(allocator *)&module);
                pOVar10 = cxxopts::Options::operator[](&options,(string *)&e);
                pvVar12 = cxxopts::OptionDetails::
                          as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                    (pOVar10);
                std::__cxx11::string::~string((string *)&e);
                local_b08 = (pvVar12->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish;
                pbVar18 = (pvVar12->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                while (pbVar18 != local_b08) {
                  local_b00 = pbVar18;
                  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                  basic_regex<std::char_traits<char>,std::allocator<char>>
                            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&role,pbVar18,
                             0x10);
                  local_c70 = 0;
                  if ((local_c08 & 0xffffffff) <
                      (ulong)((long)deviceRoles.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)deviceRoles.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2)) {
                    pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                        (&deviceRoles,local_c08 & 0xffffffff);
                    local_c70 = *pvVar13;
                  }
                  local_af8 = moduleArgs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  for (pbVar18 = moduleArgs.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start; pbVar18 != local_af8;
                      pbVar18 = (pointer)&pbVar18[2].field_2) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                    *(uint *)((long)&e.m_message.field_2 + *(long *)(e._0_8_ + -0x18)) =
                         *(uint *)((long)&e.m_message.field_2 + *(long *)(e._0_8_ + -0x18)) &
                         0xffffffb5 | 8;
                    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&e);
                    poVar9 = std::operator<<(poVar9,",");
                    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                    poVar9 = std::operator<<(poVar9,",");
                    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                    poVar9 = std::operator<<(poVar9,",");
                    std::operator<<(poVar9,(string *)(pbVar18->field_2)._M_local_buf);
                    std::__cxx11::stringbuf::str();
                    bVar5 = std::
                            regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&module,
                                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&role
                                       ,0);
                    std::__cxx11::string::~string((string *)&module);
                    if (bVar5) {
                      std::__cxx11::string::string
                                ((string *)&module,(string *)pbVar18[1].field_2._M_local_buf);
                      module._user1._0_4_ = local_c70;
                      std::vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>::
                      emplace_back<EvdevDevice::Input>(&inputs,(Input *)&module);
                      std::__cxx11::string::~string((string *)&module);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
                  }
                  local_c08 = (ulong)((int)local_c08 + 1);
                  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&role);
                  pbVar18 = local_b00 + 1;
                }
                std::vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>::
                ~vector((vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>
                         *)&moduleArgs);
              }
              pIVar3 = inputs.
                       super__Vector_base<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              pIVar16 = inputs.
                        super__Vector_base<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              if (0 < iVar6) {
                for (; pIVar16 != pIVar3; pIVar16 = pIVar16 + 1) {
                  poVar9 = std::operator<<((ostream *)&std::cout,"Using device ");
                  poVar9 = std::operator<<(poVar9,(string *)pIVar16);
                  poVar9 = std::operator<<(poVar9," with role ");
                  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                  std::endl<char,std::char_traits<char>>(poVar9);
                }
              }
              EvdevDevice::EvdevDevice((EvdevDevice *)&e,&inputs);
              p_evdev = (EvdevDevice *)&e;
              if ((pointer)e._0_8_ == e.m_message._M_dataplus._M_p) {
                poVar9 = std::operator<<((ostream *)&std::cerr,"ERROR: Could not open input device")
                ;
                std::endl<char,std::char_traits<char>>(poVar9);
                iVar7 = 1;
              }
              else {
                std::__cxx11::string::string((string *)&role,"p",(allocator *)&moduleArgs);
                pOVar10 = cxxopts::Options::operator[](&options,(string *)&role);
                pbVar11 = cxxopts::OptionDetails::as<std::__cxx11::string>(pOVar10);
                FunKeyMonkeyModule::FunKeyMonkeyModule(&module,pbVar11);
                std::__cxx11::string::~string((string *)&role);
                if (module._lib == (void *)0x0) {
                  pcVar19 = "ERROR: Could not open plugin";
LAB_0012ec36:
                  poVar9 = std::operator<<((ostream *)&std::cerr,pcVar19);
LAB_0012ec42:
                  std::endl<char,std::char_traits<char>>(poVar9);
                  iVar7 = 1;
                }
                else {
                  std::__cxx11::string::string((string *)&role,"g",(allocator *)&moduleArgs);
                  iVar6 = cxxopts::Options::count(&options,(string *)&role);
                  if (iVar6 == 0) {
                    std::__cxx11::string::~string((string *)&role);
                  }
                  else {
                    bVar5 = EvdevDevice::grab((EvdevDevice *)&e,true);
                    std::__cxx11::string::~string((string *)&role);
                    if (!bVar5) {
                      pcVar19 = "ERROR: Could not grab input device";
                      goto LAB_0012ec36;
                    }
                  }
                  std::__cxx11::string::string((string *)&role,"d",(allocator *)&moduleArgs);
                  iVar6 = cxxopts::Options::count(&options,(string *)&role);
                  if (iVar6 == 0) {
                    std::__cxx11::string::~string((string *)&role);
                  }
                  else {
                    iVar6 = daemon(1,0);
                    std::__cxx11::string::~string((string *)&role);
                    if (iVar6 == -1) {
                      poVar9 = std::operator<<((ostream *)&std::cerr,
                                               "ERROR: Could not daemonize, error code ");
                      piVar14 = __errno_location();
                      poVar9 = (ostream *)std::ostream::operator<<(poVar9,*piVar14);
                      goto LAB_0012ec42;
                    }
                  }
                  std::__cxx11::string::string((string *)&role,"X",(allocator *)&local_ae8);
                  pOVar10 = cxxopts::Options::operator[](&options,(string *)&role);
                  pvVar12 = cxxopts::OptionDetails::
                            as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                      (pOVar10);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&moduleArgs,pvVar12);
                  std::__cxx11::string::~string((string *)&role);
                  process((EvdevDevice *)&e,&module,&moduleArgs);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&moduleArgs);
                  iVar7 = 0;
                }
                FunKeyMonkeyModule::~FunKeyMonkeyModule(&module);
              }
              EvdevDevice::~EvdevDevice((EvdevDevice *)&e);
              std::vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>::~vector(&inputs)
              ;
            }
            else {
              std::__cxx11::string::string((string *)&e,"r",(allocator *)&role);
              pOVar10 = cxxopts::Options::operator[](&options,(string *)&e);
              pbVar11 = cxxopts::OptionDetails::as<std::__cxx11::string>(pOVar10);
              std::__cxx11::string::string((string *)&module,(string *)pbVar11);
              std::__cxx11::string::~string((string *)&e);
              std::__cxx11::istringstream::istringstream
                        ((istringstream *)&e,(string *)&module,_S_in);
              uVar1 = *(uint *)((long)&e.m_message.field_2 + *(long *)(e._0_8_ + -0x18) + 8);
              do {
                uVar17 = uVar1;
                if ((uVar17 & 5) != 0) {
                  iVar7 = 0;
                  goto LAB_0012e733;
                }
                role = 0;
                std::istream::_M_extract<unsigned_int>((uint *)&e);
                if ((e.m_message.field_2._M_local_buf[*(long *)(e._0_8_ + -0x18) + 8] & 5U) != 0) {
                  poVar9 = std::operator<<((ostream *)&std::cerr,"ERROR: Invalid role list: ");
                  poVar9 = std::operator<<(poVar9,(string *)&module);
                  std::endl<char,std::char_traits<char>>(poVar9);
                  goto LAB_0012e730;
                }
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          (&deviceRoles,&role);
                cVar4 = std::istream::get();
                uVar1 = *(uint *)((long)&e.m_message.field_2 + *(long *)(e._0_8_ + -0x18) + 8);
              } while ((cVar4 == ',') || ((uVar1 & 5) != 0));
              poVar9 = std::operator<<((ostream *)&std::cerr,"ERROR: Invalid role list: ");
              poVar9 = std::operator<<(poVar9,(string *)&module);
              std::endl<char,std::char_traits<char>>(poVar9);
LAB_0012e730:
              iVar7 = 1;
LAB_0012e733:
              std::__cxx11::istringstream::~istringstream((istringstream *)&e);
              std::__cxx11::string::~string((string *)&module);
              if ((uVar17 & 5) != 0) goto LAB_0012e754;
            }
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      (&deviceRoles.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
            ;
            goto LAB_0012e474;
          }
          pcVar19 = "ERROR: exactly one plugin is required";
        }
        poVar9 = std::operator<<((ostream *)&std::cerr,pcVar19);
        std::endl<char,std::char_traits<char>>(poVar9);
        iVar7 = 1;
        goto LAB_0012e474;
      }
      EvdevDevice::availableDevices();
      for (; (pointer)e._0_8_ != e.m_message._M_dataplus._M_p; e._0_8_ = e._0_8_ + 0x50) {
        *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
             *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8
        ;
        poVar9 = std::operator<<((ostream *)&std::cout,(string *)(e._0_8_ + 0x30));
        poVar9 = std::operator<<(poVar9,": ");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        poVar9 = std::operator<<(poVar9,",");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        poVar9 = std::operator<<(poVar9,",");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        poVar9 = std::operator<<(poVar9,",");
        poVar9 = std::operator<<(poVar9,(string *)(e._0_8_ + 0x10));
        std::endl<char,std::char_traits<char>>(poVar9);
      }
      std::vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>::~vector
                ((vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_> *)&e);
    }
    else {
      std::__cxx11::string::string((string *)&e,"",(allocator *)&deviceRoles);
      std::__cxx11::string::string
                ((string *)(e.m_message.field_2._M_local_buf + 8),"Group",(allocator *)&inputs);
      __l_00._M_len = 2;
      __l_00._M_array = (iterator)&e;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&role,__l_00,(allocator_type *)&moduleArgs);
      cxxopts::Options::help
                ((string *)&module,&options,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&role);
      poVar9 = std::operator<<((ostream *)&std::cout,(string *)&module);
      std::endl<char,std::char_traits<char>>(poVar9);
      std::__cxx11::string::~string((string *)&module);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&role);
      lVar15 = 0x20;
      do {
        std::__cxx11::string::~string((string *)(&e.super_exception + lVar15));
        lVar15 = lVar15 + -0x20;
      } while (lVar15 != -0x20);
    }
  }
  iVar7 = 0;
LAB_0012e474:
  cxxopts::Options::~Options(&options);
  return iVar7;
}

Assistant:

int main(int argc, char** argv)
{
  cxxopts::Options options(argv[0], " - A evdev/uinput wrangler");
  options.add_options()
    ("i,device", "Input device to read from, eg. /dev/input/event0, multiple can be provided",
     cxxopts::value<std::vector<std::string>>(), "PATH")
    ("m,match-devices", "Regular expression to match device strings (format: '<vendor>,<product>,<version>,<name>') with, matching will be read, multiple can be provided",
     cxxopts::value<std::vector<std::string>>(), "PATTERN")
    ("r,roles", "A comma-separated list of role numbers. Roles will be assigned to devices in order of definition, path-based first. Devices matching a match-devices get one role.", cxxopts::value<std::string>(), "ROLES")
    ("p,plugin", "Path to plugin", cxxopts::value<std::string>(), "PATH")
    ("g,grab", "Grab the input device, preventing others from accessing it")
    ("v,verbose", "Print extra runtime information")
    ("d,daemonize", "Daemonize process")
    ("l,list-devices", "List available devices")
    ("X,plugin-parameter", "Plugin parameter",
     cxxopts::value<std::vector<std::string>>(), "ARG")
    ("h,help", "Print help");

  if(argc == 1)
  {
    std::cout << options.help({"", "Group"}) << std::endl;
    return EXIT_SUCCESS;
  }

  try
  {
    options.parse(argc, argv);
  }
  catch(cxxopts::OptionException e)
  {
    std::cerr << "ERROR: parsing options failed: " << e.what() << std::endl;
    return EXIT_FAILURE;
  }

  bool const verbose = options.count("v") > 0;

  if(options.count("h"))
  {
    std::cout << options.help({"", "Group"}) << std::endl;
    return EXIT_SUCCESS;
  }

  if(options.count("l"))
  {
    std::vector<EvdevDevice::Information> devices = EvdevDevice::availableDevices();
    for(EvdevDevice::Information const& device : devices)
    {
      std::cout << std::hex
        << device.path << ": "
        << device.vendor << ","
        << device.product << ","
        << device.version << ","
        << device.name << std::endl;
    }
    return EXIT_SUCCESS;
  }

  if(options.count("i") < 1 && options.count("m") < 1)
  {
    std::cerr << "ERROR: at least one input device path or match pattern is required" << std::endl;
    return EXIT_FAILURE;
  }

  if(options.count("p") != 1)
  {
    std::cerr << "ERROR: exactly one plugin is required" << std::endl;
    return EXIT_FAILURE;
  }

  std::vector<unsigned int> deviceRoles;
  if(options.count("r"))
  {
    std::string const roles = options["r"].as<std::string>();
    std::istringstream iss(roles);
    while(iss)
    {
      unsigned int role = 0;
      iss >> role;

      if(!iss)
      {
        std::cerr << "ERROR: Invalid role list: " << roles << std::endl;
        return EXIT_FAILURE;
      }

      deviceRoles.push_back(role);

      char separator = iss.get();
      if(iss && separator != ',')
      {
        std::cerr << "ERROR: Invalid role list: " << roles << std::endl;
        return EXIT_FAILURE;
      }
    }
  }

  std::vector<EvdevDevice::Input> inputs;
  for(std::string const& path : options["i"].as<std::vector<std::string>>())
  {
    unsigned int role = deviceRoles.size() > inputs.size() ? deviceRoles.at(inputs.size()) : 0;
    inputs.push_back({path, role});
  }

  if(options.count("m") > 0)
  {
    unsigned int roleIndex = inputs.size();
    std::vector<EvdevDevice::Information> devices = EvdevDevice::availableDevices();
    for(std::string const& pattern : options["m"].as<std::vector<std::string>>())
    {
      std::regex re(pattern);
      unsigned int role = deviceRoles.size() > roleIndex ? deviceRoles.at(roleIndex) : 0;
      for(EvdevDevice::Information const& info : devices)
      {
        std::ostringstream deviceString;
        deviceString << std::hex
          << info.vendor << ","
          << info.product << ","
          << info.version << ","
          << info.name;
        if(std::regex_search(deviceString.str(), re))
        {
          inputs.push_back({info.path, role});
        }
      }
      roleIndex += 1;
    }
  }

  if(verbose)
  {
    for(auto const& input : inputs)
    {
      std::cout << "Using device " << input.path << " with role " << input.role << std::endl;
    }
  }

  EvdevDevice evdev(inputs);
  p_evdev  = &evdev;

  if(!evdev.ready())
  {
    std::cerr << "ERROR: Could not open input device" << std::endl;
    return EXIT_FAILURE;
  }

  FunKeyMonkeyModule module(options["p"].as<std::string>());

  if(!module.ready())
  {
    std::cerr << "ERROR: Could not open plugin" << std::endl;
    return EXIT_FAILURE;
  }

  if(options.count("g") && !evdev.grab(true))
  {
    std::cerr << "ERROR: Could not grab input device" << std::endl;
    return EXIT_FAILURE;
  }

  if(options.count("d") && daemon(1, 0) == -1)
  {
    std::cerr << "ERROR: Could not daemonize, error code " << errno << std::endl;
    return EXIT_FAILURE;
  }

  std::vector<std::string> moduleArgs = options["X"].as<std::vector<std::string>>();

  process(evdev, module, moduleArgs);

  return EXIT_SUCCESS;
}